

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
DensityCalculator<long_double,_float>::push_bdens_fast_route
          (DensityCalculator<long_double,_float> *this,double split_point,size_t col)

{
  longdouble lVar1;
  longdouble *plVar2;
  iterator iVar3;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble local_38;
  longdouble local_28;
  
  fmaxl();
  fminl();
  logl();
  iVar3._M_current =
       (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar1 = iVar3._M_current[-1];
  in_ST2 = lVar1 + in_ST2;
  local_28 = in_ST2;
  fmaxl();
  fminl();
  logl();
  local_38 = lVar1 + in_ST3;
  plVar2 = (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == plVar2) {
    std::vector<long_double,std::allocator<long_double>>::_M_realloc_insert<long_double_const&>
              ((vector<long_double,std::allocator<long_double>> *)this,iVar3,&local_38);
    iVar3._M_current =
         (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    plVar2 = (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_38;
    iVar3._M_current = iVar3._M_current + 1;
    (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == plVar2) {
    std::vector<long_double,std::allocator<long_double>>::_M_realloc_insert<long_double_const&>
              ((vector<long_double,std::allocator<long_double>> *)this,iVar3,&local_28);
  }
  else {
    *iVar3._M_current = in_ST2;
    (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  push_bdens_internal(this,split_point,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}